

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fs_init(LexState *ls,FuncState *fs)

{
  lua_State *L_00;
  TValue *pTVar1;
  GCtab *pGVar2;
  lua_State *L;
  FuncState *fs_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs->prev = ls->fs;
  ls->fs = fs;
  fs->ls = ls;
  fs->vbase = ls->vtop;
  fs->L = L_00;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = 0xffffffff;
  fs->freereg = 0;
  fs->nkgc = 0;
  fs->nkn = 0;
  fs->nactvar = 0;
  fs->nuv = '\0';
  fs->bl = (FuncScope *)0x0;
  fs->flags = '\0';
  fs->framesize = '\x01';
  pGVar2 = lj_tab_new(L_00,0,0);
  fs->kt = pGVar2;
  L_00->top->u64 = (ulong)fs->kt | 0xfffa000000000000;
  pTVar1 = L_00->top;
  L_00->top = pTVar1 + 1;
  if ((TValue *)(L_00->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L_00);
  }
  return;
}

Assistant:

static void fs_init(LexState *ls, FuncState *fs)
{
  lua_State *L = ls->L;
  fs->prev = ls->fs; ls->fs = fs;  /* Append to list. */
  fs->ls = ls;
  fs->vbase = ls->vtop;
  fs->L = L;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JMP;
  fs->freereg = 0;
  fs->nkgc = 0;
  fs->nkn = 0;
  fs->nactvar = 0;
  fs->nuv = 0;
  fs->bl = NULL;
  fs->flags = 0;
  fs->framesize = 1;  /* Minimum frame size. */
  fs->kt = lj_tab_new(L, 0, 0);
  /* Anchor table of constants in stack to avoid being collected. */
  settabV(L, L->top, fs->kt);
  incr_top(L);
}